

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strconv.c
# Opt level: O2

int jsonp_dtostr(char *buffer,size_t size,double value,int precision)

{
  uint uVar1;
  lconv *plVar2;
  char *pcVar3;
  int iVar4;
  char *__src;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  
  iVar4 = 0x11;
  if (precision != 0) {
    iVar4 = precision;
  }
  uVar1 = snprintf(buffer,size,"%.*g",iVar4);
  iVar4 = -1;
  if ((-1 < (int)uVar1) && (uVar7 = (ulong)uVar1, uVar7 < size)) {
    plVar2 = localeconv();
    if ((*plVar2->decimal_point != 0x2e) &&
       (pcVar3 = strchr(buffer,(int)*plVar2->decimal_point), pcVar3 != (char *)0x0)) {
      *pcVar3 = '.';
    }
    pcVar3 = strchr(buffer,0x2e);
    if ((pcVar3 == (char *)0x0) && (pcVar3 = strchr(buffer,0x65), pcVar3 == (char *)0x0)) {
      if (size <= uVar7 + 3) {
        return -1;
      }
      (buffer + uVar7)[0] = '.';
      (buffer + uVar7)[1] = '0';
      buffer[uVar7 + 2] = '\0';
      uVar7 = uVar7 + 2;
    }
    pcVar3 = strchr(buffer,0x65);
    if (pcVar3 != (char *)0x0) {
      pcVar5 = pcVar3 + (1 - uVar7);
      __src = pcVar3 + 1;
      do {
        pcVar5 = pcVar5 + 1;
        pcVar6 = __src + 1;
        __src = __src + 1;
      } while (*pcVar6 == '0');
      pcVar6 = pcVar3 + 1;
      if (pcVar3[1] == '-') {
        pcVar6 = pcVar3 + 2;
      }
      if (__src != pcVar6) {
        memmove(pcVar6,__src,(long)buffer - (long)pcVar5);
        uVar7 = (long)pcVar6 - (long)pcVar5;
      }
    }
    iVar4 = (int)uVar7;
  }
  return iVar4;
}

Assistant:

int jsonp_dtostr(char *buffer, size_t size, double value, int precision) {
    int ret;
    char *start, *end;
    size_t length;

    if (precision == 0)
        precision = 17;

    ret = snprintf(buffer, size, "%.*g", precision, value);
    if (ret < 0)
        return -1;

    length = (size_t) ret;
    if (length >= size)
        return -1;

#if JSON_HAVE_LOCALECONV
    from_locale(buffer);
#endif

    /* Make sure there's a dot or 'e' in the output. Otherwise
       a real is converted to an integer when decoding */
    if (strchr(buffer, '.') == NULL && strchr(buffer, 'e') == NULL) {
        if (length + 3 >= size) {
            /* No space to append ".0" */
            return -1;
        }
        buffer[length] = '.';
        buffer[length + 1] = '0';
        buffer[length + 2] = '\0';
        length += 2;
    }

    /* Remove leading '+' from positive exponent. Also remove leading
       zeros from exponents (added by some printf() implementations) */
    start = strchr(buffer, 'e');
    if (start) {
        start++;
        end = start + 1;

        if (*start == '-')
            start++;

        while (*end == '0')
            end++;

        if (end != start) {
            memmove(start, end, length - (size_t) (end - buffer));
            length -= (size_t) (end - start);
        }
    }

    return (int) length;
}